

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

int gray_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  FT_Outline *outline;
  FT_Bitmap *pFVar1;
  PCell_conflict pTVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int coverage;
  PCell *ppTVar7;
  PCell *ppTVar8;
  int x;
  TCoord x_00;
  ulong uVar9;
  int iVar10;
  int iVar11;
  FT_Pos FVar12;
  int y;
  size_t __n;
  PCell_conflict local_4268;
  TCell buffer [682];
  gray_TWorker_ local_1f8;
  undefined1 local_88 [8];
  FT_BBox cbox;
  int local_48;
  ulong local_38;
  uint uVar6;
  
  if (raster == (FT_Raster)0x0) {
    return 6;
  }
  if ((params->flags & 1U) == 0) {
    return 0x13;
  }
  outline = (FT_Outline *)params->source;
  if (outline == (FT_Outline *)0x0) {
    return 0x14;
  }
  if ((outline->n_points != 0) && (0 < (long)outline->n_contours)) {
    if (outline->contours == (short *)0x0) {
      return 0x14;
    }
    if (outline->points == (FT_Vector *)0x0) {
      return 0x14;
    }
    if (outline->contours[(long)outline->n_contours + -1] + 1 != (int)outline->n_points) {
      return 0x14;
    }
    pFVar1 = params->target;
    local_1f8.outline.flags = outline->flags;
    local_1f8.outline._36_4_ = *(undefined4 *)&outline->field_0x24;
    local_1f8.outline.n_contours = outline->n_contours;
    local_1f8.outline.n_points = outline->n_points;
    local_1f8.outline._4_4_ = *(undefined4 *)&outline->field_0x4;
    local_1f8.outline.points = outline->points;
    local_1f8.outline.tags = outline->tags;
    local_1f8.outline.contours = outline->contours;
    if ((params->flags & 2U) == 0) {
      if (pFVar1 == (FT_Bitmap *)0x0) {
        return 6;
      }
      if (pFVar1->width == 0) {
        return 0;
      }
      if (pFVar1->rows == 0) {
        return 0;
      }
      if (pFVar1->buffer == (uchar *)0x0) {
        return 6;
      }
      local_1f8.target.pitch = pFVar1->pitch;
      uVar9 = 0;
      if (-1 < local_1f8.target.pitch) {
        uVar9 = (ulong)((pFVar1->rows - 1) * local_1f8.target.pitch);
      }
      local_1f8.target.origin = pFVar1->buffer + uVar9;
      local_1f8.render_span = (FT_SpanFunc)0x0;
      local_1f8.render_span_data = (void *)0x0;
    }
    else {
      local_1f8.render_span = params->gray_spans;
      if (local_1f8.render_span == (FT_SpanFunc)0x0) {
        return 0;
      }
      local_1f8.render_span_data = params->user;
    }
    FT_Outline_Get_CBox(outline,(FT_BBox *)local_88);
    if ((0x1000000 < cbox.xMax || 0x1000000 < cbox.yMin) ||
        (cbox.xMin < -0x1000000 || (long)local_88 < -0x1000000)) {
      return 0x14;
    }
    local_88 = (undefined1  [8])((long)local_88 >> 6);
    cbox.xMin = cbox.xMin >> 6;
    cbox.yMin = cbox.yMin + 0x3f >> 6;
    cbox.xMax = cbox.xMax + 0x3f >> 6;
    if ((params->flags & 2U) == 0) {
      uVar4 = (ulong)pFVar1->rows;
      uVar9 = (ulong)pFVar1->width;
      local_38 = 0;
      FVar12 = 0;
    }
    else if ((params->flags & 4U) == 0) {
      local_38 = 0xffffffffffff8000;
      uVar4 = 0x7fff;
      uVar9 = 0x7fff;
      FVar12 = -0x8000;
    }
    else {
      FVar12 = (params->clip_box).xMin;
      local_38 = (params->clip_box).yMin;
      uVar9 = (params->clip_box).xMax;
      uVar4 = (params->clip_box).yMax;
    }
    if (FVar12 < (long)local_88) {
      FVar12 = (FT_Pos)local_88;
    }
    iVar11 = (int)FVar12;
    local_1f8.min_ex = iVar11;
    if ((long)local_38 < cbox.xMin) {
      local_38 = cbox.xMin;
    }
    if (cbox.yMin < (long)uVar9) {
      uVar9 = cbox.yMin;
    }
    iVar10 = (int)uVar9;
    local_1f8.max_ex = iVar10;
    if (cbox.xMax < (long)uVar4) {
      uVar4 = cbox.xMax;
    }
    if (iVar11 < iVar10) {
      uVar6 = (uint)uVar4;
      uVar5 = uVar6 - (int)local_38;
      if (uVar5 == 0 || (int)uVar6 < (int)local_38) {
        return 0;
      }
      uVar9 = (ulong)(int)uVar5;
      if (0x55 < uVar5) {
        uVar4 = (uVar9 + 0x54) / 0x55;
        uVar9 = ((uVar4 + uVar9) - 1) / uVar4;
      }
      __n = uVar9 * 8;
      uVar4 = (uVar9 * 8 + 0x17) / 0x18;
      local_1f8.cells = (PCell_conflict)&buffer[uVar4 - 1].next;
      local_1f8.max_cells = 0x2aa - uVar4;
      local_1f8.ycells = &local_4268;
      cbox.yMax = __n;
      while (local_1f8.min_ey = (TCoord)local_38, local_1f8.min_ey < (int)uVar6) {
        local_48 = (int)uVar9;
        uVar5 = local_1f8.min_ey + local_48;
        local_38 = (ulong)uVar5;
        local_1f8.max_ey = uVar6;
        if ((int)uVar5 < (int)uVar6) {
          local_1f8.max_ey = uVar5;
        }
        buffer[0x2a9].next._4_4_ = iVar11;
        buffer[0x2a9].next._0_4_ = iVar10;
        ppTVar7 = &buffer[0x2a9].next;
        do {
          uVar5 = *(int *)ppTVar7 - *(int *)((long)ppTVar7 + 4);
          memset(local_1f8.ycells,0,__n);
          local_1f8.num_cells = 0;
          local_1f8.invalid = 1;
          local_1f8.min_ex = *(int *)((long)ppTVar7 + 4);
          local_1f8.max_ex = *(TCoord *)ppTVar7;
          iVar3 = gray_convert_glyph_inner(&local_1f8);
          if (iVar3 == 0x40) {
            if (uVar5 < 2) {
              return 1;
            }
            *(int *)(ppTVar7 + 1) = *(int *)((long)ppTVar7 + 4);
            *(int *)((long)ppTVar7 + 4) = ((int)uVar5 >> 1) + *(int *)((long)ppTVar7 + 4);
            ppTVar7 = (PCell *)((long)ppTVar7 + 4);
          }
          else {
            y = local_1f8.min_ey;
            if (iVar3 != 0) {
              return 1;
            }
            for (; y < local_1f8.max_ey; y = y + 1) {
              iVar3 = 0;
              ppTVar8 = local_1f8.ycells + ((long)y - (long)local_1f8.min_ey);
              x_00 = local_1f8.min_ex;
              while (pTVar2 = *ppTVar8, pTVar2 != (PCell_conflict)0x0) {
                x = pTVar2->x;
                if ((iVar3 != 0) && (x - x_00 != 0 && x_00 <= x)) {
                  gray_hline(&local_1f8,x_00,y,iVar3,x - x_00);
                  x = pTVar2->x;
                }
                iVar3 = iVar3 + pTVar2->cover * 0x200;
                coverage = iVar3 - pTVar2->area;
                if ((coverage != 0) && (local_1f8.min_ex <= x)) {
                  gray_hline(&local_1f8,x,y,coverage,1);
                  x = pTVar2->x;
                }
                x_00 = x + 1;
                ppTVar8 = &pTVar2->next;
              }
              if (iVar3 != 0) {
                gray_hline(&local_1f8,x_00,y,iVar3,local_1f8.max_ex - x_00);
              }
            }
            ppTVar7 = (PCell *)((long)ppTVar7 + -4);
            __n = cbox.yMax;
          }
        } while (&buffer[0x2a9].next <= ppTVar7);
      }
    }
  }
  return 0;
}

Assistant:

static int
  gray_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    const FT_Outline*  outline    = (const FT_Outline*)params->source;
    const FT_Bitmap*   target_map = params->target;
    FT_BBox            cbox, clip;

#ifndef FT_STATIC_RASTER
    gray_TWorker  worker[1];
#endif


    if ( !raster )
      return FT_THROW( Invalid_Argument );

    /* this version does not support monochrome rendering */
    if ( !( params->flags & FT_RASTER_FLAG_AA ) )
      return FT_THROW( Invalid_Mode );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return FT_THROW( Invalid_Outline );

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return FT_THROW( Invalid_Outline );

    ras.outline = *outline;

    if ( params->flags & FT_RASTER_FLAG_DIRECT )
    {
      if ( !params->gray_spans )
        return 0;

      ras.render_span      = (FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }
    else
    {
      /* if direct mode is not set, we must have a target bitmap */
      if ( !target_map )
        return FT_THROW( Invalid_Argument );

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return FT_THROW( Invalid_Argument );

      if ( target_map->pitch < 0 )
        ras.target.origin = target_map->buffer;
      else
        ras.target.origin = target_map->buffer
              + ( target_map->rows - 1 ) * (unsigned int)target_map->pitch;

      ras.target.pitch = target_map->pitch;

      ras.render_span      = (FT_Raster_Span_Func)NULL;
      ras.render_span_data = NULL;
    }

    FT_Outline_Get_CBox( outline, &cbox );

    /* reject too large outline coordinates */
    if ( cbox.xMin < -0x1000000L || cbox.xMax > 0x1000000L ||
         cbox.yMin < -0x1000000L || cbox.yMax > 0x1000000L )
      return FT_THROW( Invalid_Outline );

    /* truncate the bounding box to integer pixels */
    cbox.xMin = cbox.xMin >> 6;
    cbox.yMin = cbox.yMin >> 6;
    cbox.xMax = ( cbox.xMax + 63 ) >> 6;
    cbox.yMax = ( cbox.yMax + 63 ) >> 6;

    /* compute clipping box */
    if ( !( params->flags & FT_RASTER_FLAG_DIRECT ) )
    {
      /* compute clip box from target pixmap */
      clip.xMin = 0;
      clip.yMin = 0;
      clip.xMax = (FT_Pos)target_map->width;
      clip.yMax = (FT_Pos)target_map->rows;
    }
    else if ( params->flags & FT_RASTER_FLAG_CLIP )
      clip = params->clip_box;
    else
    {
      clip.xMin = -32768L;
      clip.yMin = -32768L;
      clip.xMax =  32767L;
      clip.yMax =  32767L;
    }

    /* clip to target bitmap, exit if nothing to do */
    ras.min_ex = FT_MAX( cbox.xMin, clip.xMin );
    ras.min_ey = FT_MAX( cbox.yMin, clip.yMin );
    ras.max_ex = FT_MIN( cbox.xMax, clip.xMax );
    ras.max_ey = FT_MIN( cbox.yMax, clip.yMax );

    if ( ras.max_ex <= ras.min_ex || ras.max_ey <= ras.min_ey )
      return 0;

    return gray_convert_glyph( RAS_VAR );
  }